

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

bool Search::cached_action_store_or_find
               (search_private *priv,ptag mytag,ptag *condition_on,char *condition_on_names,
               action_repr *condition_on_actions,size_t condition_on_cnt,int policy,
               size_t learner_id,action *a,bool do_store,float *a_cost)

{
  scored_action sVar1;
  ulong len;
  uchar *__ptr;
  uint64_t hash_00;
  scored_action *psVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  ulong in_R9;
  uchar in_stack_00000008;
  scored_action sa;
  action *in_stack_00000018;
  uint64_t hash;
  size_t i;
  uchar *here;
  uchar *item;
  size_t sz;
  size_t in_stack_00000148;
  uint64_t in_stack_00000158;
  uchar **in_stack_00000160;
  v_hashmap<unsigned_char_*,_Search::scored_action> *in_stack_00000168;
  uchar **in_stack_ffffffffffffff88;
  scored_action in_stack_ffffffffffffff90;
  ulong local_60;
  uchar *local_58;
  undefined7 in_stack_ffffffffffffffc0;
  bool local_1;
  
  local_1 = (bool)((byte)hash & 1);
  if (((*(byte *)(in_RDI + 0x7c) & 1) == 0) && (in_ESI != 0)) {
    len = in_R9 * 9 + 0x20;
    if ((len & 3) != 0) {
      len = (4 - (len & 3)) + len;
    }
    __ptr = calloc_or_throw<unsigned_char>(in_stack_00000148);
    *__ptr = (uchar)len;
    __ptr[8] = (uchar)in_ESI;
    __ptr[0xc] = in_stack_00000008;
    __ptr[0x10] = (uchar)sa.a;
    __ptr[0x18] = (uchar)in_R9;
    local_58 = __ptr + 0x20;
    for (local_60 = 0; local_60 < in_R9; local_60 = local_60 + 1) {
      *local_58 = (uchar)*(undefined4 *)(in_RDX + local_60 * 4);
      local_58[4] = (uchar)*(undefined4 *)(in_R8 + local_60 * 0x10);
      local_58[8] = *(uchar *)(in_RCX + local_60);
      local_58 = local_58 + 9;
    }
    hash_00 = uniform_hash((void *)CONCAT17(local_1,in_stack_ffffffffffffffc0),len,(uint64_t)__ptr);
    if ((local_1 & 1U) == 0) {
      psVar2 = v_hashmap<unsigned_char_*,_Search::scored_action>::get
                         (in_stack_00000168,in_stack_00000160,in_stack_00000158);
      sVar1 = *psVar2;
      *in_stack_00000018 = sVar1.a;
      *(float *)i = sVar1.s;
      free(__ptr);
      local_1 = *in_stack_00000018 != 0xffffffff;
    }
    else {
      psVar2 = (scored_action *)(in_RDI + 0x2f8);
      scored_action::scored_action
                ((scored_action *)&stack0xffffffffffffff90,*in_stack_00000018,*(float *)i);
      v_hashmap<unsigned_char_*,_Search::scored_action>::put
                ((v_hashmap<unsigned_char_*,_Search::scored_action> *)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88,hash_00,psVar2);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool cached_action_store_or_find(search_private& priv, ptag mytag, const ptag* condition_on,
    const char* condition_on_names, action_repr* condition_on_actions, size_t condition_on_cnt, int policy,
    size_t learner_id, action& a, bool do_store, float& a_cost)
{
  if (priv.no_caching)
    return do_store;
  if (mytag == 0)
    return do_store;  // don't attempt to cache when tag is zero

  size_t sz = sizeof(size_t) + sizeof(ptag) + sizeof(int) + sizeof(size_t) + sizeof(size_t) +
      condition_on_cnt * (sizeof(ptag) + sizeof(action) + sizeof(char));
  if (sz % 4 != 0)
    sz += 4 - (sz % 4);  // make sure sz aligns to 4 so that uniform_hash does the right thing

  unsigned char* item = calloc_or_throw<unsigned char>(sz);
  unsigned char* here = item;
  *here = (unsigned char)sz;
  here += sizeof(size_t);
  *here = mytag;
  here += sizeof(ptag);
  *here = policy;
  here += sizeof(int);
  *here = (unsigned char)learner_id;
  here += sizeof(size_t);
  *here = (unsigned char)condition_on_cnt;
  here += sizeof(size_t);
  for (size_t i = 0; i < condition_on_cnt; i++)
  {
    *here = condition_on[i];
    here += sizeof(ptag);
    *here = condition_on_actions[i].a;
    here += sizeof(action);
    *here = condition_on_names[i];
    here += sizeof(char);  // SPEEDUP: should we align this at 4?
  }
  uint64_t hash = uniform_hash(item, sz, 3419);

  if (do_store)
  {
    priv.cache_hash_map.put(item, hash, scored_action(a, a_cost));
    return true;
  }
  else  // its a find
  {
    scored_action sa = priv.cache_hash_map.get(item, hash);
    a = sa.a;
    a_cost = sa.s;
    free(item);
    return a != (action)-1;
  }
}